

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void hiberlite::
     hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,std::__cxx11::string,std::__cxx11::string>
               (AVisitor<hiberlite::KillChildren> *ar,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *m,uint param_3)

{
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> s;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> f;
  allocator local_1b2;
  allocator local_1b1;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e8
  ;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a0
  ;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_58
  ;
  
  std::__cxx11::string::string((string *)&local_150,"first",(allocator *)&local_130);
  std::__cxx11::string::string((string *)&local_170,"",&local_1b2);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_58,&local_150,&m->first,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_190,"second",&local_1b2);
  std::__cxx11::string::string((string *)&local_1b0,"",&local_1b1);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_130,&local_190,&m->second,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_a0,&local_58);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_a0);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_a0);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_e8,&local_130);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_e8);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_e8);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_130);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_58);
  return;
}

Assistant:

void hibernate(A& ar, std::pair<First,Second>& m, const unsigned int)
{
	sql_nvp<First> f("first", m.first);
	sql_nvp<Second> s("second", m.second);
	ar & f;
	ar & s;
}